

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Forel.cpp
# Opt level: O2

void __thiscall Forel::print_clusters(Forel *this,ofstream *out,string *filename)

{
  double dVar1;
  pointer pPVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  pointer pCVar8;
  int j;
  long lVar9;
  pointer pCVar10;
  long lVar11;
  int i;
  long lVar12;
  Cluster g;
  vector<double,_std::allocator<double>_> values;
  Point p;
  string filename_forel;
  string filename_gnu;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  string arrow_name;
  ofstream out_arrow;
  ofstream out_gnu;
  ofstream out_forel;
  
  std::ofstream::ofstream(&out_gnu);
  std::ofstream::ofstream(&out_arrow);
  std::ofstream::ofstream(&out_forel);
  cVar3 = (char)filename;
  std::__cxx11::string::rfind(cVar3,0x2e);
  std::__cxx11::string::substr((ulong)&filename_gnu,(ulong)filename);
  std::operator+(&arrow_name,&filename_gnu,"_arrow");
  std::__cxx11::string::~string((string *)&filename_gnu);
  std::__cxx11::string::rfind(cVar3,0x2e);
  std::__cxx11::string::substr((ulong)&filename_forel,(ulong)filename);
  std::operator+(&filename_gnu,&filename_forel,"_gnu.plt");
  std::__cxx11::string::~string((string *)&filename_forel);
  std::__cxx11::string::rfind(cVar3,0x2e);
  std::__cxx11::string::substr((ulong)&g,(ulong)filename);
  std::operator+(&filename_forel,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&g,
                 "circle_centres");
  std::__cxx11::string::~string((string *)&g);
  std::ofstream::open((string *)&out_gnu,(_Ios_Openmode)&filename_gnu);
  std::ofstream::open((string *)&out_arrow,(_Ios_Openmode)&arrow_name);
  std::ofstream::open((string *)&out_forel,(_Ios_Openmode)&filename_forel);
  poVar7 = std::operator<<((ostream *)&out_gnu,"rgb(r,g,b) = 65536 * int(r) + 256 * int(g) + int(b)"
                          );
  std::endl<char,std::char_traits<char>>(poVar7);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                 "plot \'/Users/AlinaArslanova/untitled1/cmake-build-debug/",filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&g,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                 "\' using 1:2:(rgb($3,$4,$5))  notitle with points lc rgb variable,");
  poVar7 = std::operator<<((ostream *)&out_gnu,(string *)&g);
  std::operator+(&local_670," \'/Users/AlinaArslanova/untitled1/cmake-build-debug/",&filename_forel)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&values,
                 &local_670,"\' with circles");
  std::operator<<(poVar7,(string *)&values);
  std::__cxx11::string::~string((string *)&values);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&g);
  std::__cxx11::string::~string((string *)&p);
  std::ofstream::open((string *)out,(_Ios_Openmode)filename);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    poVar7 = std::operator<<((ostream *)&std::cout,"Errors in opening");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    lVar11 = 0;
    lVar9 = 0;
    while( true ) {
      pCVar10 = (this->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar8 = (this->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((int)(((long)pCVar8 - (long)pCVar10) / 0x18) <= lVar9) break;
      if (10 < (ulong)((*(long *)((long)&(pCVar10->points).
                                         super__Vector_base<Point,_std::allocator<Point>_>._M_impl +
                                 lVar11 + 8) -
                       *(long *)((long)&(pCVar10->points).
                                        super__Vector_base<Point,_std::allocator<Point>_>._M_impl +
                                lVar11)) / 0x18)) {
        std::vector<Point,_std::allocator<Point>_>::vector
                  ((vector<Point,_std::allocator<Point>_> *)&g,
                   (vector<Point,_std::allocator<Point>_> *)
                   ((long)&(pCVar10->points).super__Vector_base<Point,_std::allocator<Point>_>.
                           _M_impl + lVar11));
        Cluster::find_mass_centre(&p,&g);
        Cluster::find_vectors(&values,&g);
        poVar7 = std::ostream::_M_insert<double>(p.x);
        std::operator<<(poVar7," ");
        poVar7 = std::ostream::_M_insert<double>(p.y);
        std::operator<<(poVar7," ");
        poVar7 = std::ostream::_M_insert<double>
                           (*values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start);
        std::operator<<(poVar7," ");
        poVar7 = std::ostream::_M_insert<double>
                           (values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[1]);
        std::endl<char,std::char_traits<char>>(poVar7);
        poVar7 = std::ostream::_M_insert<double>(p.x);
        std::operator<<(poVar7," ");
        poVar7 = std::ostream::_M_insert<double>(p.y);
        std::operator<<(poVar7," ");
        poVar7 = std::ostream::_M_insert<double>
                           (values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[2]);
        std::operator<<(poVar7," ");
        poVar7 = std::ostream::_M_insert<double>
                           (values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[3]);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&values.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base
                  ((_Vector_base<Point,_std::allocator<Point>_> *)&g);
      }
      lVar9 = lVar9 + 1;
      lVar11 = lVar11 + 0x18;
    }
    for (lVar9 = 0; lVar9 < (int)(((long)pCVar8 - (long)pCVar10) / 0x18); lVar9 = lVar9 + 1) {
      iVar4 = rand();
      iVar5 = rand();
      iVar6 = rand();
      std::vector<Point,_std::allocator<Point>_>::vector
                (&g.points,
                 &(this->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar9].points);
      lVar12 = 0;
      lVar11 = 0;
      while( true ) {
        if ((int)(((long)g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x18) <= lVar11) break;
        poVar7 = std::ostream::_M_insert<double>
                           (*(double *)
                             ((long)&(g.points.super__Vector_base<Point,_std::allocator<Point>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->x + lVar12));
        std::operator<<(poVar7," ");
        poVar7 = std::ostream::_M_insert<double>
                           (*(double *)
                             ((long)&(g.points.super__Vector_base<Point,_std::allocator<Point>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->y + lVar12));
        poVar7 = std::operator<<(poVar7," ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4 % 0x101);
        poVar7 = std::operator<<(poVar7," ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5 % 0x101);
        poVar7 = std::operator<<(poVar7," ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6 % 0x101);
        poVar7 = std::operator<<(poVar7," ");
        std::endl<char,std::char_traits<char>>(poVar7);
        lVar11 = lVar11 + 1;
        lVar12 = lVar12 + 0x18;
      }
      std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base
                ((_Vector_base<Point,_std::allocator<Point>_> *)&g);
      pCVar10 = (this->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar8 = (this->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    lVar9 = 0x10;
    lVar11 = 0;
    while( true ) {
      pPVar2 = (this->forel_circles).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((int)(((long)(this->forel_circles).super__Vector_base<Point,_std::allocator<Point>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pPVar2) / 0x18) <= lVar11)
      break;
      dVar1 = *(double *)((long)&pPVar2->eps + lVar9);
      poVar7 = std::ostream::_M_insert<double>(*(double *)((long)pPVar2 + lVar9 + -8));
      std::operator<<(poVar7," ");
      poVar7 = std::ostream::_M_insert<double>(dVar1);
      std::operator<<(poVar7," ");
      poVar7 = std::ostream::_M_insert<double>(this->forel_r);
      std::endl<char,std::char_traits<char>>(poVar7);
      lVar11 = lVar11 + 1;
      lVar9 = lVar9 + 0x18;
    }
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::close();
  }
  std::__cxx11::string::~string((string *)&filename_forel);
  std::__cxx11::string::~string((string *)&filename_gnu);
  std::__cxx11::string::~string((string *)&arrow_name);
  std::ofstream::~ofstream(&out_forel);
  std::ofstream::~ofstream(&out_arrow);
  std::ofstream::~ofstream(&out_gnu);
  return;
}

Assistant:

void Forel::print_clusters(ofstream &out,string filename) {
    ofstream out_gnu;
    ofstream out_arrow;
    ofstream out_forel;
    string arrow_name=filename.substr(0, filename.find_last_of('.')) + "_arrow";
    string filename_gnu = filename.substr(0, filename.find_last_of('.')) + "_gnu.plt";
    string filename_forel = filename.substr(0, filename.find_last_of('.')) + "circle_centres";
    out_gnu.open(filename_gnu);
    out_arrow.open(arrow_name);
    out_forel.open(filename_forel);
    out_gnu << "rgb(r,g,b) = 65536 * int(r) + 256 * int(g) + int(b)" << endl;

    out_gnu << "plot '/Users/AlinaArslanova/untitled1/cmake-build-debug/" + filename +
               "' using 1:2:(rgb($3,$4,$5))  notitle with points lc rgb variable," <<
            " '/Users/AlinaArslanova/untitled1/cmake-build-debug/" + filename_forel + "' with circles";

    out.open(filename);
    //log("printing clusters to " + filename);


    int a, b, c;
    if (!out.is_open()) {
        cout << "Errors in opening" << endl;
    } else {

        for (int i = 0; i < (int) clusters.size(); i++) {
            if (clusters[i].points.size() > 10) {

                Cluster g = clusters[i];
                Point p = g.find_mass_centre();
                vector<double> values = g.find_vectors();
                out_arrow << p.x << " " << p.y << " " << values[0] << " " << values[1] << endl;
                out_arrow << p.x << " " << p.y << " " << values[2] << " " << values[3] << endl;

            }
        }

        for (int i = 0; i < (int) clusters.size(); i++) {

            a = rand() % 257;
            b = rand() % 257;
            c = rand() % 257;
            Cluster g = clusters[i];
            for (int j = 0; j < (int) g.points.size(); j++) {

                out << g.points[j].x << " " << g.points[j].y << " " << a << " " << b << " " << c << " " << endl;
            }


        }
        {

            for (int i = 0; i < (int) forel_circles.size(); i++) {
                Point g = forel_circles[i];
                out_forel << g.x << " " << g.y << " " << forel_r << endl;
            }


        }
        out.close();
        out_arrow.close();
        out_gnu.close();
        out_forel.close();
    }

}